

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner-unix.c
# Opt level: O3

int process_wait(process_info_t *vec,int n,int timeout)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  uint uVar5;
  long lVar6;
  dowait_args args;
  timeval tv;
  timeval timebase;
  pthread_t tid;
  fd_set fds;
  pthread_attr_t attr;
  int local_130 [2];
  process_info_t *local_128;
  int local_120;
  timeval local_118;
  timeval local_100;
  pthread_t local_f0;
  fd_set local_e8;
  pthread_attr_t local_68;
  
  local_130[0] = -1;
  local_130[1] = -1;
  local_128 = vec;
  local_120 = n;
  if (timeout == -1) {
    dowait(local_130);
    iVar1 = 0;
  }
  else {
    iVar1 = pipe(local_130);
    if (iVar1 == 0) {
      iVar1 = pthread_attr_init(&local_68);
      if ((iVar1 == 0) && (iVar1 = pthread_attr_setstacksize(&local_68,0x40000), iVar1 == 0)) {
        iVar1 = pthread_create(&local_f0,&local_68,dowait,local_130);
        iVar2 = pthread_attr_destroy(&local_68);
        if (iVar2 == 0) {
          if (iVar1 != 0) {
            perror("pthread_create()");
            iVar1 = -1;
LAB_0017ba42:
            closefd(local_130[0]);
            closefd(local_130[1]);
            return iVar1;
          }
          iVar1 = gettimeofday(&local_100,(__timezone_ptr_t)0x0);
          if (iVar1 == 0) {
            local_118.tv_sec = local_100.tv_sec;
            local_118.tv_usec = local_100.tv_usec;
            while( true ) {
              if ((local_118.tv_sec <= local_100.tv_sec) &&
                 ((local_118.tv_sec != local_100.tv_sec || (local_118.tv_usec < local_100.tv_usec)))
                 ) {
                __assert_fail("tv.tv_sec > timebase.tv_sec || (tv.tv_sec == timebase.tv_sec && tv.tv_usec >= timebase.tv_usec)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/runner-unix.c"
                              ,300,"int process_wait(process_info_t *, int, int)");
              }
              uVar5 = ((int)(SUB168(SEXT816(local_118.tv_usec) * SEXT816(0x20c49ba5e353f7cf),8) >> 7
                            ) - (SUB164(SEXT816(local_118.tv_usec) * SEXT816(0x20c49ba5e353f7cf),0xc
                                       ) >> 0x1f)) +
                      ((int)(SUB168(SEXT816(local_100.tv_usec) * SEXT816(-0x20c49ba5e353f7cf),8) >>
                            7) -
                      (SUB164(SEXT816(local_100.tv_usec) * SEXT816(-0x20c49ba5e353f7cf),0xc) >> 0x1f
                      )) + ((int)local_118.tv_sec - (int)local_100.tv_sec) * 1000;
              uVar3 = timeout - uVar5;
              if ((uint)timeout < uVar5 || uVar3 == 0) break;
              local_118.tv_sec = (ulong)uVar3 / 1000;
              local_118.tv_usec = (__suseconds_t)((uVar3 % 1000) * 1000);
              local_e8.fds_bits[0] = 0;
              local_e8.fds_bits[1] = 0;
              local_e8.fds_bits[2] = 0;
              local_e8.fds_bits[3] = 0;
              local_e8.fds_bits[4] = 0;
              local_e8.fds_bits[5] = 0;
              local_e8.fds_bits[6] = 0;
              local_e8.fds_bits[7] = 0;
              local_e8.fds_bits[8] = 0;
              local_e8.fds_bits[9] = 0;
              local_e8.fds_bits[10] = 0;
              local_e8.fds_bits[0xb] = 0;
              iVar1 = local_130[0] + 0x3f;
              if (-1 < local_130[0]) {
                iVar1 = local_130[0];
              }
              local_e8.fds_bits[0xc] = 0;
              local_e8.fds_bits[0xd] = 0;
              local_e8.fds_bits[0xe] = 0;
              local_e8.fds_bits[0xf] = 0;
              local_e8.fds_bits[iVar1 >> 6] =
                   local_e8.fds_bits[iVar1 >> 6] | 1L << ((byte)(local_130[0] % 0x40) & 0x3f);
              iVar1 = select(local_130[0] + 1,&local_e8,(fd_set *)0x0,(fd_set *)0x0,&local_118);
              if (iVar1 != -1) {
                if (iVar1 == 0) break;
                iVar1 = 0;
                goto LAB_0017ba32;
              }
              piVar4 = __errno_location();
              if (*piVar4 != 4) {
                perror("select()");
                iVar1 = -1;
                goto LAB_0017ba32;
              }
              iVar1 = gettimeofday(&local_118,(__timezone_ptr_t)0x0);
              if (iVar1 != 0) goto LAB_0017b9e8;
            }
            iVar1 = -2;
            if (0 < n) {
              lVar6 = 0;
              do {
                kill(*(__pid_t *)((long)&vec->pid + lVar6),0xf);
                lVar6 = lVar6 + 0x20;
              } while ((ulong)(uint)n << 5 != lVar6);
            }
LAB_0017ba32:
            iVar2 = pthread_join(local_f0,(void **)0x0);
            if (iVar2 == 0) goto LAB_0017ba42;
          }
        }
      }
LAB_0017b9e8:
      abort();
    }
    perror("pipe()");
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int process_wait(process_info_t* vec, int n, int timeout) {
  int i;
  int r;
  int retval;
  process_info_t* p;
  dowait_args args;
  pthread_t tid;
  pthread_attr_t attr;
  unsigned int elapsed_ms;
  struct timeval timebase;
  struct timeval tv;
  fd_set fds;

  args.vec = vec;
  args.n = n;
  args.pipe[0] = -1;
  args.pipe[1] = -1;

  /* The simple case is where there is no timeout */
  if (timeout == -1) {
    dowait(&args);
    return 0;
  }

  /* Hard case. Do the wait with a timeout.
   *
   * Assumption: we are the only ones making this call right now. Otherwise
   * we'd need to lock vec.
   */

  r = pipe((int*)&(args.pipe));
  if (r) {
    perror("pipe()");
    return -1;
  }

  if (pthread_attr_init(&attr))
    abort();

#if defined(__MVS__)
  if (pthread_attr_setstacksize(&attr, 1024 * 1024))
#else
  if (pthread_attr_setstacksize(&attr, 256 * 1024))
#endif
    abort();

  r = pthread_create(&tid, &attr, dowait, &args);

  if (pthread_attr_destroy(&attr))
    abort();

  if (r) {
    perror("pthread_create()");
    retval = -1;
    goto terminate;
  }

  if (gettimeofday(&timebase, NULL))
    abort();

  tv = timebase;
  for (;;) {
    /* Check that gettimeofday() doesn't jump back in time. */
    assert(tv.tv_sec > timebase.tv_sec ||
           (tv.tv_sec == timebase.tv_sec && tv.tv_usec >= timebase.tv_usec));

    elapsed_ms =
        (tv.tv_sec - timebase.tv_sec) * 1000 +
        (tv.tv_usec / 1000) -
        (timebase.tv_usec / 1000);

    r = 0;  /* Timeout. */
    if (elapsed_ms >= (unsigned) timeout)
      break;

    tv.tv_sec = (timeout - elapsed_ms) / 1000;
    tv.tv_usec = (timeout - elapsed_ms) % 1000 * 1000;

    FD_ZERO(&fds);
    FD_SET(args.pipe[0], &fds);

    r = select(args.pipe[0] + 1, &fds, NULL, NULL, &tv);
    if (!(r == -1 && errno == EINTR))
      break;

    if (gettimeofday(&tv, NULL))
      abort();
  }

  if (r == -1) {
    perror("select()");
    retval = -1;

  } else if (r) {
    /* The thread completed successfully. */
    retval = 0;

  } else {
    /* Timeout. Kill all the children. */
    for (i = 0; i < n; i++) {
      p = &vec[i];
      kill(p->pid, SIGTERM);
    }
    retval = -2;
  }

  if (pthread_join(tid, NULL))
    abort();

terminate:
  closefd(args.pipe[0]);
  closefd(args.pipe[1]);
  return retval;
}